

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

parser_error parse_monster_color_cycle(parser *p)

{
  parser_error pVar1;
  monster_race *race;
  char *group_name;
  char *cycle_name;
  
  race = (monster_race *)parser_priv(p);
  group_name = parser_getsym(p,"group");
  cycle_name = parser_getsym(p,"cycle");
  if (race == (monster_race *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pVar1 = PARSE_ERROR_INVALID_VALUE;
    if (((group_name != (char *)0x0) && (cycle_name != (char *)0x0 && *group_name != '\0')) &&
       (*cycle_name != '\0')) {
      visuals_cycler_set_cycle_for_race(race,group_name,cycle_name);
      pVar1 = PARSE_ERROR_NONE;
    }
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_monster_color_cycle(struct parser *p)
{
	struct monster_race *r = parser_priv(p);
	const char *group = parser_getsym(p, "group");
	const char *cycle = parser_getsym(p, "cycle");

	if (r == NULL)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	if (group == NULL || strlen(group) == 0)
		return PARSE_ERROR_INVALID_VALUE;

	if (cycle == NULL || strlen(cycle) == 0)
		return PARSE_ERROR_INVALID_VALUE;

	visuals_cycler_set_cycle_for_race(r, group, cycle);

	return PARSE_ERROR_NONE;
}